

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::TagExpression::matches
          (TagExpression *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  bool bVar1;
  pointer this_00;
  __normal_iterator<const_Catch::TagSet_*,_std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>_>
  local_30;
  const_iterator itEnd;
  const_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags_local;
  TagExpression *this_local;
  
  itEnd = std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::begin(&this->m_tagSets);
  local_30._M_current =
       (TagSet *)std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::end(&this->m_tagSets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_30);
    if (!bVar1) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::TagSet_*,_std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>_>
              ::operator->(&itEnd);
    bVar1 = TagSet::matches(this_00,tags);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TagSet_*,_std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>_>
    ::operator++(&itEnd);
  }
  return true;
}

Assistant:

bool matches( std::set<std::string> const& tags ) const {
            std::vector<TagSet>::const_iterator it = m_tagSets.begin();
            std::vector<TagSet>::const_iterator itEnd = m_tagSets.end();
            for(; it != itEnd; ++it )
                if( it->matches( tags ) )
                    return true;
            return false;
        }